

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_elements_issuance_calculate_reissuance_token
              (uchar *entropy,size_t entropy_len,uint32_t flags,uchar *bytes_out,size_t len)

{
  uchar local_58 [8];
  uchar buff [32];
  size_t len_local;
  uchar *bytes_out_local;
  uint32_t flags_local;
  size_t entropy_len_local;
  uchar *entropy_local;
  
  buff._24_8_ = len;
  memset(local_58,0,0x20);
  if ((flags & 0xfffffffe) == 0) {
    local_58[0] = (char)flags + '\x01';
    entropy_local._4_4_ =
         tx_elements_token_from_bytes(entropy,entropy_len,local_58,0x20,bytes_out,buff._24_8_);
  }
  else {
    entropy_local._4_4_ = -2;
  }
  return entropy_local._4_4_;
}

Assistant:

int wally_tx_elements_issuance_calculate_reissuance_token(const unsigned char *entropy,
                                                          size_t entropy_len,
                                                          uint32_t flags,
                                                          unsigned char *bytes_out,
                                                          size_t len)
{
    unsigned char buff[SHA256_LEN] = { 0 };

    if ((flags & ~WALLY_TX_FLAG_BLINDED_INITIAL_ISSUANCE))
        return WALLY_EINVAL;

    /* 32-byte '1' constant for unblinded and '2' for confidential */
    buff[0] = flags + 1;
    return tx_elements_token_from_bytes(entropy, entropy_len,
                                        buff, sizeof(buff),
                                        bytes_out, len);
}